

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_dict.cpp
# Opt level: O2

void duckdb_brotli::BrotliInitSharedEncoderDictionary(SharedEncoderDictionary *dict)

{
  BrotliDictionary *pBVar1;
  BrotliTransforms *pBVar2;
  
  dict->magic = 0xdebcede1;
  (dict->compound).chunk_offsets[0] = 0;
  (dict->compound).num_prepared_instances_ = 0;
  (dict->contextual).context_based = 0;
  (dict->compound).num_chunks = 0;
  (dict->compound).total_size = 0;
  (dict->contextual).num_dictionaries = '\x01';
  (dict->contextual).instances_ = (BrotliEncoderDictionary *)0x0;
  (dict->contextual).num_instances_ = 1;
  (dict->contextual).dict[0] = &(dict->contextual).instance_;
  pBVar1 = BrotliGetDictionary();
  (dict->contextual).instance_.words = pBVar1;
  pBVar2 = BrotliGetTransforms();
  (dict->contextual).instance_.num_transforms = pBVar2->num_transforms;
  (dict->contextual).instance_.hash_table_words = (uint16_t *)kStaticDictionaryHashWords;
  (dict->contextual).instance_.hash_table_lengths = kStaticDictionaryHashLengths;
  (dict->contextual).instance_.buckets = (uint16_t *)&kStaticDictionaryBuckets;
  (dict->contextual).instance_.dict_words = (DictWord *)kStaticDictionaryWords;
  (dict->contextual).instance_.cutoffTransformsCount = 10;
  (dict->contextual).instance_.cutoffTransforms = 0x71b520ada2d3200;
  (dict->contextual).instance_.has_words_heavy = 0;
  (dict->contextual).instance_.trie.root.len_ = '\0';
  (dict->contextual).instance_.trie.root.idx_ = 0;
  (dict->contextual).instance_.trie.root.sub = 0;
  *(undefined8 *)((long)&(dict->contextual).instance_.trie.pool_capacity + 1) = 0;
  *(undefined8 *)((long)&(dict->contextual).instance_.trie.pool_size + 1) = 0;
  (dict->contextual).instance_.trie.pool = (BrotliTrieNode *)0x0;
  (dict->contextual).instance_.trie.pool_capacity = 0;
  (dict->contextual).instance_.dict_words_alloc_size_ = 0;
  (dict->contextual).instance_.dict_words_data_ = (DictWord *)0x0;
  (dict->contextual).instance_.words_instance_ = (BrotliDictionary *)0x0;
  (dict->contextual).instance_.buckets_alloc_size_ = 0;
  (dict->contextual).instance_.buckets_data_ = (uint16_t *)0x0;
  (dict->contextual).instance_.hash_table_data_words_ = (uint16_t *)0x0;
  (dict->contextual).instance_.hash_table_data_lengths_ = (uint8_t *)0x0;
  (dict->contextual).instance_.parent = &dict->contextual;
  dict->max_quality = 0xb;
  return;
}

Assistant:

void duckdb_brotli::BrotliInitSharedEncoderDictionary(SharedEncoderDictionary* dict) {
  dict->magic = kSharedDictionaryMagic;

  dict->compound.num_chunks = 0;
  dict->compound.total_size = 0;
  dict->compound.chunk_offsets[0] = 0;
  dict->compound.num_prepared_instances_ = 0;

  dict->contextual.context_based = 0;
  dict->contextual.num_dictionaries = 1;
  dict->contextual.instances_ = 0;
  dict->contextual.num_instances_ = 1;  /* The instance_ field */
  dict->contextual.dict[0] = &dict->contextual.instance_;
  InitEncoderDictionary(&dict->contextual.instance_);
  dict->contextual.instance_.parent = &dict->contextual;

  dict->max_quality = BROTLI_MAX_QUALITY;
}